

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vitals.c
# Opt level: O0

void mmk_panic(char *str,...)

{
  char in_AL;
  undefined8 in_RCX;
  char *pcVar1;
  undefined8 in_RDX;
  char *pcVar2;
  undefined8 in_RSI;
  FILE *ctx;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_d8 [8];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined1 local_28 [8];
  va_list vl;
  char *str_local;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  vl[0].overflow_arg_area = local_d8;
  vl[0]._0_8_ = &stack0x00000008;
  local_28._4_4_ = 0x30;
  local_28._0_4_ = 8;
  ctx = _stderr;
  local_d0 = in_RSI;
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  vl[0].reg_save_area = str;
  (*mmk_vfprintf_)((FILE *)_stderr,str,(__va_list_tag *)local_28);
  mmk_abort();
  mmk_vfprintf_ =
       (_func_void_FILE_ptr_char_ptr___va_list_tag_ptr *)plt_get_real_fn((plt_ctx)ctx,"vfprintf");
  mmk_abort_ = (_func_void *)plt_get_real_fn((plt_ctx)ctx,"abort");
  if ((mmk_abort_ == (_func_void *)0x0) ||
     (mmk_vfprintf_ == (_func_void_FILE_ptr_char_ptr___va_list_tag_ptr *)0x0)) {
    pcVar2 = "\'abort\'";
    if (mmk_abort_ != (_func_void *)0x0) {
      pcVar2 = "";
    }
    pcVar1 = "\'vfprintf\'";
    if (mmk_vfprintf_ != (_func_void_FILE_ptr_char_ptr___va_list_tag_ptr *)0x0) {
      pcVar1 = "";
    }
    fprintf(_stderr,
            "mimick: Initialization error: could not find definitions for vital function(s): %s %s\n"
            ,pcVar2,pcVar1);
    abort();
  }
  mmk_malloc_ = (_func_void_ptr_size_t *)plt_get_real_fn((plt_ctx)ctx,"malloc");
  if (mmk_malloc_ == (_func_void_ptr_size_t *)0x0) {
    mmk_panic(
             "mimick: Initialization error: could not find definition for vital function \'malloc\'.\n"
             );
  }
  mmk_realloc_ = (_func_void_ptr_void_ptr_size_t *)plt_get_real_fn((plt_ctx)ctx,"realloc");
  if (mmk_realloc_ == (_func_void_ptr_void_ptr_size_t *)0x0) {
    mmk_panic(
             "mimick: Initialization error: could not find definition for vital function \'realloc\'.\n"
             );
  }
  mmk_free_ = (_func_void_void_ptr *)plt_get_real_fn((plt_ctx)ctx,"free");
  if (mmk_free_ == (_func_void_void_ptr *)0x0) {
    mmk_panic(
             "mimick: Initialization error: could not find definition for vital function \'free\'.\n"
             );
  }
  mmk_mprotect_ = (_func_int_void_ptr_size_t_int *)plt_get_real_fn((plt_ctx)ctx,"mprotect");
  if (mmk_mprotect_ == (_func_int_void_ptr_size_t_int *)0x0) {
    mmk_panic(
             "mimick: Initialization error: could not find definition for vital function \'mprotect\'.\n"
             );
  }
  return;
}

Assistant:

mmk_noreturn void mmk_panic(const char *str, ...)
{
    va_list vl;
    va_start(vl, str);
    mmk_vfprintf_(stderr, str, vl);
    va_end(vl);
    mmk_abort();
    mmk_unreachable();
}